

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int iVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  long lVar7;
  
  psVar5 = s->img_buffer;
  psVar4 = s->img_buffer_end;
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  lVar7 = 0;
  while( true ) {
    if (psVar5 < psVar4) {
      s->img_buffer = psVar5 + 1;
      sVar6 = *psVar5;
      psVar5 = psVar5 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      sVar6 = '\0';
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar6 = '\0';
        psVar4 = psVar2;
      }
      else {
        sVar6 = *psVar1;
        psVar4 = psVar1 + iVar3;
      }
      s->img_buffer_end = psVar4;
      s->img_buffer = psVar2;
      psVar5 = psVar2;
    }
    if (sVar6 != stbi__check_png_header::png_sig[lVar7]) break;
    lVar7 = lVar7 + 1;
    if (lVar7 == 8) {
      return 1;
    }
  }
  stbi__g_failure_reason = "bad png sig";
  return 0;
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static const stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}